

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * GetFrontMostModalRootWindow(void)

{
  ImGuiWindow *pIVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(uint)(GImGui->OpenPopupStack).Size;
  lVar3 = uVar2 * 0x28 + -0x20;
  while( true ) {
    if ((int)uVar2 < 1) {
      return (ImGuiWindow *)0x0;
    }
    pIVar1 = *(ImGuiWindow **)((long)&((GImGui->OpenPopupStack).Data)->PopupId + lVar3);
    if ((pIVar1 != (ImGuiWindow *)0x0) && ((pIVar1->Flags & 0x4000000) != 0)) break;
    uVar2 = (ulong)((int)uVar2 - 1);
    lVar3 = lVar3 + -0x28;
  }
  return pIVar1;
}

Assistant:

static ImGuiWindow* GetFrontMostModalRootWindow()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size-1; n >= 0; n--)
        if (ImGuiWindow* front_most_popup = g.OpenPopupStack.Data[n].Window)
            if (front_most_popup->Flags & ImGuiWindowFlags_Modal)
                return front_most_popup;
    return NULL;
}